

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O0

bool woff2::RemoveDigitalSignature(Font *font)

{
  bool bVar1;
  size_type sVar2;
  _Self local_20;
  _Self local_18;
  iterator it;
  Font *font_local;
  
  it._M_node = (_Base_ptr)font;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
       ::find(&font->tables,(key_type *)0x13d018);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
       ::end((map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
              *)&(it._M_node)->_M_parent);
  bVar1 = std::operator!=(&local_18,&local_20);
  if (bVar1) {
    std::
    map<unsigned_int,woff2::Font::Table,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,woff2::Font::Table>>>
    ::erase_abi_cxx11_((map<unsigned_int,woff2::Font::Table,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,woff2::Font::Table>>>
                        *)&(it._M_node)->_M_parent,(iterator)local_18._M_node);
    sVar2 = std::
            map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
            ::size((map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                    *)&(it._M_node)->_M_parent);
    *(short *)&(it._M_node)->field_0x4 = (short)sVar2;
  }
  return true;
}

Assistant:

bool RemoveDigitalSignature(Font* font) {
  std::map<uint32_t, Font::Table>::iterator it =
      font->tables.find(kDsigTableTag);
  if (it != font->tables.end()) {
    font->tables.erase(it);
    font->num_tables = font->tables.size();
  }
  return true;
}